

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int bitset_lenrange_cardinality(uint64_t *words,uint32_t start,uint32_t lenminusone)

{
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = (ulong)(start >> 6);
  uVar1 = lenminusone + start >> 6;
  bVar3 = (byte)start;
  if (start >> 6 == uVar1) {
    uVar4 = words[uVar4] &
            (0xffffffffffffffffU >> (0x3fU - (char)lenminusone & 0x3f)) << (bVar3 & 0x3f);
    uVar4 = uVar4 - (uVar4 >> 1 & 0x5555555555555555);
    uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
    uVar1 = (uint)(byte)(((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
  }
  else {
    uVar5 = (words[uVar4] >> (bVar3 & 0x3f)) << (bVar3 & 0x3f);
    uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
    uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
    uVar5 = ((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38;
    while( true ) {
      uVar4 = uVar4 + 1;
      if (uVar1 <= uVar4) break;
      uVar2 = words[uVar4] - (words[uVar4] >> 1 & 0x5555555555555555);
      uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
      uVar5 = (ulong)((int)uVar5 +
                     (uint)(byte)(((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                                 0x38));
    }
    bVar3 = ~(byte)(lenminusone + start);
    uVar4 = (words[uVar1] << (bVar3 & 0x3f)) >> (bVar3 & 0x3f);
    uVar4 = uVar4 - (uVar4 >> 1 & 0x5555555555555555);
    uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
    uVar1 = (int)uVar5 +
            (uint)(byte)(((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
  }
  return uVar1;
}

Assistant:

static inline int bitset_lenrange_cardinality(const uint64_t *words,
                                              uint32_t start,
                                              uint32_t lenminusone) {
    uint32_t firstword = start / 64;
    uint32_t endword = (start + lenminusone) / 64;
    if (firstword == endword) {
        return hamming(words[firstword] &
                       ((~UINT64_C(0)) >> ((63 - lenminusone) % 64))
                           << (start % 64));
    }
    int answer = hamming(words[firstword] & ((~UINT64_C(0)) << (start % 64)));
    for (uint32_t i = firstword + 1; i < endword; i++) {
        answer += hamming(words[i]);
    }
    answer +=
        hamming(words[endword] &
                (~UINT64_C(0)) >> (((~start + 1) - lenminusone - 1) % 64));
    return answer;
}